

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_loop_shape.cc
# Opt level: O0

Edge * __thiscall
S2VertexIdLaxLoopShape::edge(Edge *__return_storage_ptr__,S2VertexIdLaxLoopShape *this,int e0)

{
  int iVar1;
  ostream *poVar2;
  S2Point *_v0;
  S2Point *_v1;
  int local_40;
  int e1;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  int local_14;
  S2VertexIdLaxLoopShape *pSStack_10;
  int e0_local;
  S2VertexIdLaxLoopShape *this_local;
  
  local_14 = e0;
  pSStack_10 = this;
  iVar1 = num_edges(this);
  if (e0 < iVar1) {
    local_40 = local_14 + 1;
    iVar1 = num_vertices(this);
    if (local_40 == iVar1) {
      local_40 = 0;
    }
    _v0 = vertex(this,local_14);
    _v1 = vertex(this,local_40);
    S2Shape::Edge::Edge(__return_storage_ptr__,_v0,_v1);
    return __return_storage_ptr__;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_loop_shape.cc"
             ,0x57,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_28);
  poVar2 = std::operator<<(poVar2,"Check failed: (e0) < (num_edges()) ");
  S2LogMessageVoidify::operator&(&local_15,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
}

Assistant:

S2Shape::Edge S2VertexIdLaxLoopShape::edge(int e0) const {
  S2_DCHECK_LT(e0, num_edges());
  int e1 = e0 + 1;
  if (e1 == num_vertices()) e1 = 0;
  return Edge(vertex(e0), vertex(e1));
}